

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax
          (ASTContext *context,ModportNamedPortSyntax *syntax,bool isExport)

{
  SubroutineSymbol *pSVar1;
  MethodPrototypeSymbol *pMVar2;
  SubroutineSymbol **ppSVar3;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> sVar4;
  SubroutineSymbol *target;
  MethodPrototypeSymbol *result;
  Compilation *in_stack_00000070;
  undefined1 in_stack_00000078 [16];
  bool in_stack_000000bf;
  SyntaxNode *in_stack_000000c0;
  Scope *in_stack_000000c8;
  undefined1 in_stack_000000d0 [16];
  SubroutineSymbol *in_stack_ffffffffffffff88;
  optional<const_slang::ast::SubroutineSymbol_*> *in_stack_ffffffffffffff90;
  pointer local_50;
  __extent_storage<18446744073709551615UL> local_48;
  
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x6f9ab0);
  pMVar2 = createForModport(in_stack_000000c8,in_stack_000000c0,(Token)in_stack_000000d0,
                            in_stack_000000bf);
  ppSVar3 = std::optional<const_slang::ast::SubroutineSymbol_*>::value(in_stack_ffffffffffffff90);
  pSVar1 = *ppSVar3;
  if (pSVar1 != (SubroutineSymbol *)0x0) {
    DeclaredType::setLink(&pMVar2->declaredReturnType,&pSVar1->declaredReturnType);
    pMVar2->subroutineKind = pSVar1->subroutineKind;
    ASTContext::getCompilation((ASTContext *)0x6f9b54);
    SubroutineSymbol::getArguments(in_stack_ffffffffffffff88);
    sVar4 = cloneArguments(in_stack_00000070,(Scope *)context,
                           (span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                            )in_stack_00000078);
    local_50 = sVar4._M_ptr;
    (pMVar2->arguments)._M_ptr = local_50;
    local_48 = sVar4._M_extent._M_extent_value;
    (pMVar2->arguments)._M_extent._M_extent_value = local_48._M_extent_value;
  }
  return pMVar2;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const ASTContext& context,
                                                         const ModportNamedPortSyntax& syntax,
                                                         bool isExport) {
    auto& result = createForModport(*context.scope, syntax, syntax.name, isExport);
    auto target = result.subroutine.value();
    if (!target)
        return result;

    result.declaredReturnType.setLink(target->declaredReturnType);
    result.subroutineKind = target->subroutineKind;
    result.arguments = cloneArguments(context.getCompilation(), result, target->getArguments());
    return result;
}